

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O1

int __thiscall
astar::AStar::MoveCast(AStar *this,Point *start,Point *end,int horCost,int verCost,int diaCost)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = start->x - end->x;
  iVar1 = -iVar2;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  iVar3 = start->y - end->y;
  iVar2 = -iVar3;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  if (this->moveType == D8) {
    if (iVar1 - iVar2 == 0 || iVar1 < iVar2) {
      return diaCost * iVar1 + (iVar2 - iVar1) * verCost;
    }
    iVar1 = iVar2 * diaCost + (iVar1 - iVar2) * horCost;
  }
  else {
    if (this->moveType != D4) {
      return 0;
    }
    iVar1 = iVar2 * verCost + iVar1 * horCost;
  }
  return iVar1;
}

Assistant:

int AStar::MoveCast(const Point& start, const Point& end, int horCost, int verCost, int diaCost)
{
    int dx = std::labs(start.x - end.x);
    int dy = std::labs(start.y - end.y);
    int cost = 0;
    if (moveType == D4) {
        cost = dx * horCost + dy * verCost;
    }
    else if (moveType == D8) {
        if (dx > dy) {
            cost = horCost * (dx - dy) + diaCost * dy;
        }
        else {
            cost = verCost * (dy - dx) + diaCost * dx;
        }
    }
    return cost;
}